

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection.cpp
# Opt level: O0

bool flatbuffers::anon_unknown_96::VerifyObject
               (Verifier *v,Schema *schema,Object *obj,Table *table,bool required)

{
  bool bVar1;
  uchar utype_00;
  uint16_t uVar2;
  uint uVar3;
  BaseType BVar4;
  Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int> *pVVar5;
  return_type this;
  Type *pTVar6;
  String *str;
  Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int> *this_00;
  char *pcVar7;
  return_type this_01;
  Table *pTVar8;
  int __c;
  uint8_t *uval;
  uchar utype;
  voffset_t utype_offset;
  return_type child_obj;
  return_type field_def;
  uoffset_t i;
  bool required_local;
  Table *table_local;
  Object *obj_local;
  Schema *schema_local;
  Verifier *v_local;
  
  if (table == (Table *)0x0) {
    v_local._7_1_ = (bool)((required ^ 0xffU) & 1);
  }
  else {
    bVar1 = Table::VerifyTableStart(table,v);
    if (bVar1) {
      field_def._0_4_ = 0;
      while( true ) {
        pVVar5 = reflection::Object::fields(obj);
        uVar3 = Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int>::size(pVVar5);
        if (uVar3 <= (uint)field_def) break;
        pVVar5 = reflection::Object::fields(obj);
        pcVar7 = (char *)(ulong)(uint)field_def;
        this = Vector<flatbuffers::Offset<reflection::Field>,_unsigned_int>::Get
                         (pVVar5,(uint)field_def);
        pTVar6 = reflection::Field::type(this);
        BVar4 = reflection::Type::base_type(pTVar6);
        switch(BVar4) {
        case None:
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/reflection.cpp"
                        ,0xb2,
                        "bool flatbuffers::(anonymous namespace)::VerifyObject(flatbuffers::Verifier &, const reflection::Schema &, const reflection::Object &, const flatbuffers::Table *, bool)"
                       );
        case UType:
          uVar2 = reflection::Field::offset(this);
          bVar1 = Table::VerifyField<unsigned_char>(table,v,uVar2,1);
          if (!bVar1) {
            return false;
          }
          break;
        case Bool:
        case Byte:
        case UByte:
          uVar2 = reflection::Field::offset(this);
          bVar1 = Table::VerifyField<signed_char>(table,v,uVar2,1);
          if (!bVar1) {
            return false;
          }
          break;
        case Short:
        case UShort:
          uVar2 = reflection::Field::offset(this);
          bVar1 = Table::VerifyField<short>(table,v,uVar2,2);
          if (!bVar1) {
            return false;
          }
          break;
        case Int:
        case UInt:
          uVar2 = reflection::Field::offset(this);
          bVar1 = Table::VerifyField<int>(table,v,uVar2,4);
          if (!bVar1) {
            return false;
          }
          break;
        case Long:
        case ULong:
          uVar2 = reflection::Field::offset(this);
          bVar1 = Table::VerifyField<long>(table,v,uVar2,8);
          if (!bVar1) {
            return false;
          }
          break;
        case Float:
          uVar2 = reflection::Field::offset(this);
          bVar1 = Table::VerifyField<float>(table,v,uVar2,4);
          if (!bVar1) {
            return false;
          }
          break;
        case Double:
          uVar2 = reflection::Field::offset(this);
          bVar1 = Table::VerifyField<double>(table,v,uVar2,8);
          if (!bVar1) {
            return false;
          }
          break;
        case String:
          uVar2 = reflection::Field::offset(this);
          bVar1 = Table::VerifyField<unsigned_int>(table,v,uVar2,4);
          if (!bVar1) {
            return false;
          }
          str = GetFieldS(table,this);
          bVar1 = VerifierTemplate<false>::VerifyString(v,str);
          if (!bVar1) {
            return false;
          }
          break;
        case Vector:
          bVar1 = VerifyVector(v,schema,table,this);
          if (!bVar1) {
            return false;
          }
          break;
        case Obj:
          this_00 = reflection::Schema::objects(schema);
          pTVar6 = reflection::Field::type(this);
          pcVar7 = reflection::Type::index(pTVar6,pcVar7,__c);
          this_01 = Vector<flatbuffers::Offset<reflection::Object>,_unsigned_int>::Get
                              (this_00,(uint)pcVar7);
          bVar1 = reflection::Object::is_struct(this_01);
          if (bVar1) {
            uVar2 = reflection::Field::offset(this);
            bVar1 = reflection::Field::required(this);
            bVar1 = VerifyStruct(v,table,uVar2,this_01,bVar1);
            if (!bVar1) {
              return false;
            }
          }
          else {
            pTVar8 = GetFieldT(table,this);
            bVar1 = reflection::Field::required(this);
            bVar1 = VerifyObject(v,schema,this_01,pTVar8,bVar1);
            if (!bVar1) {
              return false;
            }
          }
          break;
        case Union:
          uVar2 = reflection::Field::offset(this);
          utype_00 = Table::GetField<unsigned_char>(table,uVar2 - 2,'\0');
          pTVar8 = GetFieldT(table,this);
          bVar1 = VerifyUnion(v,schema,utype_00,(uint8_t *)pTVar8,this);
          if (!bVar1) {
            return false;
          }
          break;
        default:
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/reflection.cpp"
                        ,0xfb,
                        "bool flatbuffers::(anonymous namespace)::VerifyObject(flatbuffers::Verifier &, const reflection::Schema &, const reflection::Object &, const flatbuffers::Table *, bool)"
                       );
        }
        field_def._0_4_ = (uint)field_def + 1;
      }
      bVar1 = VerifierTemplate<false>::EndTable(v);
      if (bVar1) {
        v_local._7_1_ = true;
      }
      else {
        v_local._7_1_ = false;
      }
    }
    else {
      v_local._7_1_ = false;
    }
  }
  return v_local._7_1_;
}

Assistant:

static bool VerifyObject(flatbuffers::Verifier &v,
                         const reflection::Schema &schema,
                         const reflection::Object &obj,
                         const flatbuffers::Table *table, bool required) {
  if (!table) return !required;
  if (!table->VerifyTableStart(v)) return false;
  for (uoffset_t i = 0; i < obj.fields()->size(); i++) {
    auto field_def = obj.fields()->Get(i);
    switch (field_def->type()->base_type()) {
      case reflection::None: FLATBUFFERS_ASSERT(false); break;
      case reflection::UType:
        if (!table->VerifyField<uint8_t>(v, field_def->offset(),
                                         sizeof(uint8_t)))
          return false;
        break;
      case reflection::Bool:
      case reflection::Byte:
      case reflection::UByte:
        if (!table->VerifyField<int8_t>(v, field_def->offset(), sizeof(int8_t)))
          return false;
        break;
      case reflection::Short:
      case reflection::UShort:
        if (!table->VerifyField<int16_t>(v, field_def->offset(),
                                         sizeof(int16_t)))
          return false;
        break;
      case reflection::Int:
      case reflection::UInt:
        if (!table->VerifyField<int32_t>(v, field_def->offset(),
                                         sizeof(int32_t)))
          return false;
        break;
      case reflection::Long:
      case reflection::ULong:
        if (!table->VerifyField<int64_t>(v, field_def->offset(),
                                         sizeof(int64_t)))
          return false;
        break;
      case reflection::Float:
        if (!table->VerifyField<float>(v, field_def->offset(), sizeof(float)))
          return false;
        break;
      case reflection::Double:
        if (!table->VerifyField<double>(v, field_def->offset(), sizeof(double)))
          return false;
        break;
      case reflection::String:
        if (!table->VerifyField<uoffset_t>(v, field_def->offset(),
                                           sizeof(uoffset_t)) ||
            !v.VerifyString(flatbuffers::GetFieldS(*table, *field_def))) {
          return false;
        }
        break;
      case reflection::Vector:
        if (!VerifyVector(v, schema, *table, *field_def)) return false;
        break;
      case reflection::Obj: {
        auto child_obj = schema.objects()->Get(field_def->type()->index());
        if (child_obj->is_struct()) {
          if (!VerifyStruct(v, *table, field_def->offset(), *child_obj,
                            field_def->required())) {
            return false;
          }
        } else {
          if (!VerifyObject(v, schema, *child_obj,
                            flatbuffers::GetFieldT(*table, *field_def),
                            field_def->required())) {
            return false;
          }
        }
        break;
      }
      case reflection::Union: {
        //  get union type from the prev field
        voffset_t utype_offset = field_def->offset() - sizeof(voffset_t);
        auto utype = table->GetField<uint8_t>(utype_offset, 0);
        auto uval = reinterpret_cast<const uint8_t *>(
            flatbuffers::GetFieldT(*table, *field_def));
        if (!VerifyUnion(v, schema, utype, uval, *field_def)) { return false; }
        break;
      }
      default: FLATBUFFERS_ASSERT(false); break;
    }
  }

  if (!v.EndTable()) return false;

  return true;
}